

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy_lock.h
# Opt level: O2

void curl_simple_lock_lock(atomic_int *lock)

{
  atomic_int aVar1;
  
  aVar1 = s_lock;
  LOCK();
  s_lock = 1;
  UNLOCK();
  if (aVar1 != 0) {
    do {
    } while( true );
  }
  return;
}

Assistant:

static CURL_INLINE void curl_simple_lock_lock(curl_simple_lock *lock)
{
  for(;;) {
    if(!atomic_exchange_explicit(lock, true, memory_order_acquire))
      break;
    /* Reduce cache coherency traffic */
    while(atomic_load_explicit(lock, memory_order_relaxed)) {
      /* Reduce load (not mandatory) */
#ifdef HAVE_BUILTIN_IA32_PAUSE
      __builtin_ia32_pause();
#elif defined(__aarch64__)
      __asm__ volatile("yield" ::: "memory");
#elif defined(_WIN32)
      Sleep(1);
#elif defined(HAVE_SCHED_YIELD)
      sched_yield();
#endif
    }
  }
}